

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# projectwriter.cpp
# Opt level: O3

void __thiscall ProjectWriter::writeMixing(ProjectWriter *this)

{
  undefined1 *puVar1;
  pointer ppNVar2;
  Node *pNVar3;
  long lVar4;
  long lVar5;
  char *__s;
  int iVar6;
  ostream *poVar7;
  size_t sVar8;
  pointer ppNVar9;
  Tank *tank;
  
  puVar1 = &this->field_0x18;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\n[MIXING]\n",10);
  ppNVar2 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->network->nodes).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar2; ppNVar9 = ppNVar9 + 1) {
    pNVar3 = *ppNVar9;
    iVar6 = (*(pNVar3->super_Element)._vptr_Element[2])(pNVar3);
    if (iVar6 == 1) {
      lVar4 = *(long *)&this->field_0x18;
      lVar5 = *(long *)(lVar4 + -0x18);
      *(uint *)(&this->field_0x30 + lVar5) =
           *(uint *)(&this->field_0x30 + lVar5) & 0xffffff4f | 0x20;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0x10;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)puVar1,(pNVar3->super_Element).name._M_dataplus._M_p,
                          (pNVar3->super_Element).name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
      lVar4 = *(long *)&this->field_0x18;
      *(undefined8 *)(&this->field_0x28 + *(long *)(lVar4 + -0x18)) = 0xc;
      *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) =
           *(uint *)(&this->field_0x30 + *(long *)(lVar4 + -0x18)) & 0xfffffefb | 4;
      *(undefined8 *)(&this->field_0x20 + *(long *)(lVar4 + -0x18)) = 4;
      __s = TankMixModel::MixingModelWords[*(int *)&pNVar3[1].xCoord];
      if (__s == (char *)0x0) {
        std::ios::clear((int)puVar1 + (int)*(undefined8 *)(lVar4 + -0x18));
      }
      else {
        sVar8 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,__s,sVar8);
      }
      poVar7 = std::ostream::_M_insert<double>(pNVar3[1].initQual);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    }
  }
  return;
}

Assistant:

void ProjectWriter::writeMixing()
{
    fout << "\n[MIXING]\n";
    for (Node* node : network->nodes)
    {
        if ( node->type() == Node::TANK )
    	{
    	    Tank* tank = static_cast<Tank*>(node);
    	    fout << left << setw(16) << node->name << " ";
    	    fout << setw(12) << fixed << setprecision(4);
    	    fout << TankMixModel::MixingModelWords[tank->mixingModel.type];
    	    fout << tank->mixingModel.fracMixed << "\n";
    	}
    }
}